

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O0

int __thiscall Network::Socket::BaseSocket::setError(BaseSocket *this,int errorCode)

{
  int iVar1;
  int *piVar2;
  int errorCode_local;
  BaseSocket *this_local;
  
  if (errorCode != -1) {
    this->lastError = Success;
    return errorCode;
  }
  piVar2 = __errno_location();
  iVar1 = *piVar2;
  if (iVar1 == 0) {
    this->lastError = Success;
    return -1;
  }
  if (iVar1 == 0xb) {
LAB_00124730:
    this->lastError = InProgress;
  }
  else {
    if (iVar1 == 0x16) {
      this->lastError = BadArgument;
      return -1;
    }
    if (iVar1 != 0x62) {
      if (iVar1 == 0x6f) {
        this->lastError = Refused;
        return -1;
      }
      if (iVar1 != 0x72) {
        if (iVar1 != 0x73) {
          this->lastError = OtherError;
          return -1;
        }
        goto LAB_00124730;
      }
    }
    this->lastError = StillInUse;
  }
  return -1;
}

Assistant:

int BaseSocket::setError(int errorCode) const
        {
            if (errorCode == -1)
            {
    #ifdef _WIN32
                switch (WSAGetLastError())
                {
                case 0: lastError = Success; return errorCode;
                case WSAEINPROGRESS:
                case WSAEWOULDBLOCK: lastError = InProgress; return errorCode;
                case WSAECONNREFUSED: lastError = Refused; return errorCode;
                case WSAEALREADY:
                case WSAEADDRINUSE: lastError = StillInUse; return errorCode;
                case WSAEINVAL: lastError = BadArgument; return errorCode;
                default: lastError = OtherError; return errorCode;
                }
    #else
                switch (errno)
                {
                case 0: lastError = Success; return errorCode;
                case EWOULDBLOCK:
                case EINPROGRESS: lastError = InProgress; return errorCode;
                case ECONNREFUSED: lastError = Refused; return errorCode;
                case EALREADY:
                case EADDRINUSE: lastError = StillInUse; return errorCode;
                case EINVAL: lastError = BadArgument; return errorCode;
                default: lastError = OtherError; return errorCode;
                }
    #endif
            }
            lastError = Success;
            return errorCode;
        }